

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

SDL12_CDstatus SDL_CDStatus(SDL12_CD *cdrom)

{
  AudioCallbackWrapperData *pAVar1;
  SDL12_CDstatus SVar2;
  char *pcVar3;
  
  if (CDRomInit == '\x01') {
    if ((cdrom != (SDL12_CD *)0x0) || (cdrom = CDRomDevice, CDRomDevice != (SDL12_CD *)0x0))
    goto LAB_0011239b;
    pcVar3 = "CD-ROM not opened";
  }
  else {
    pcVar3 = "CD-ROM subsystem not initialized";
  }
  cdrom = (SDL12_CD *)0x0;
  (*SDL20_SetError)(pcVar3);
LAB_0011239b:
  if (cdrom == (SDL12_CD *)0x0) {
    SVar2 = SDL12_CD_ERROR;
  }
  else {
    (*SDL20_LockAudio)();
    pAVar1 = audio_cbdata;
    if (audio_cbdata != (AudioCallbackWrapperData *)0x0) {
      cdrom->status = audio_cbdata->cdrom_status;
      cdrom->cur_track = pAVar1->cdrom_cur_track;
      cdrom->cur_frame = pAVar1->cdrom_cur_frame;
    }
    SVar2 = cdrom->status;
    (*SDL20_UnlockAudio)();
  }
  return SVar2;
}

Assistant:

SDLCALL
SDL_CDStatus(SDL12_CD *cdrom)
{
    SDL12_CDstatus retval;

    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return SDL12_CD_ERROR;
    }

    SDL20_LockAudio();  /* we update this during the audio callback. */
    if (audio_cbdata) {
        cdrom->status = audio_cbdata->cdrom_status;
        cdrom->cur_track = audio_cbdata->cdrom_cur_track;
        cdrom->cur_frame = audio_cbdata->cdrom_cur_frame;
    }
    retval = cdrom->status;
    SDL20_UnlockAudio();

    return retval;
}